

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5DlidxIterPrevR(Fts5Index *p,Fts5DlidxIter *pIter,int iLvl)

{
  int iVar1;
  Fts5DlidxLvl *pLvl_00;
  Fts5Data *pFVar2;
  Fts5DlidxLvl *pLvl;
  int iLvl_local;
  Fts5DlidxIter *pIter_local;
  Fts5Index *p_local;
  
  pLvl_00 = pIter->aLvl + iLvl;
  iVar1 = fts5DlidxLvlPrev(pLvl_00);
  if (((iVar1 != 0) && (iLvl + 1 < pIter->nLvl)) &&
     (fts5DlidxIterPrevR(p,pIter,iLvl + 1), pLvl_00[1].bEof == 0)) {
    fts5DataRelease(pLvl_00->pData);
    memset(pLvl_00,0,0x20);
    pFVar2 = fts5DataRead(p,((long)pIter->iSegid << 0x25) + 0x1000000000 + (long)iLvl * 0x80000000 +
                            (long)pLvl_00[1].iLeafPgno);
    pLvl_00->pData = pFVar2;
    if (pLvl_00->pData != (Fts5Data *)0x0) {
      do {
        iVar1 = fts5DlidxLvlNext(pLvl_00);
      } while (iVar1 == 0);
      pLvl_00->bEof = 0;
    }
  }
  return pIter->aLvl[0].bEof;
}

Assistant:

static int fts5DlidxIterPrevR(Fts5Index *p, Fts5DlidxIter *pIter, int iLvl){
  Fts5DlidxLvl *pLvl = &pIter->aLvl[iLvl];

  assert( iLvl<pIter->nLvl );
  if( fts5DlidxLvlPrev(pLvl) ){
    if( (iLvl+1) < pIter->nLvl ){
      fts5DlidxIterPrevR(p, pIter, iLvl+1);
      if( pLvl[1].bEof==0 ){
        fts5DataRelease(pLvl->pData);
        memset(pLvl, 0, sizeof(Fts5DlidxLvl));
        pLvl->pData = fts5DataRead(p, 
            FTS5_DLIDX_ROWID(pIter->iSegid, iLvl, pLvl[1].iLeafPgno)
        );
        if( pLvl->pData ){
          while( fts5DlidxLvlNext(pLvl)==0 );
          pLvl->bEof = 0;
        }
      }
    }
  }

  return pIter->aLvl[0].bEof;
}